

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteTailCallExports(CWriter *this,CWriterPhase kind)

{
  pointer ppEVar1;
  Export *pEVar2;
  Func *__k;
  const_iterator cVar3;
  long *plVar4;
  Newline *args;
  char (*u) [5];
  Newline *u_00;
  pointer ppEVar5;
  string_view export_name;
  string_view str;
  string mangled_name;
  string local_80;
  _Base_ptr local_60;
  SymbolMap *local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ppEVar5 = (this->module_->exports).
            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (this->module_->exports).
            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar5 != ppEVar1) {
    local_58 = &this->import_module_sym_map_;
    local_60 = &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pEVar2 = *ppEVar5;
      if (pEVar2->kind == First) {
        __k = Module::GetFunc(this->module_,&pEVar2->var);
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_58->_M_t,&__k->name);
        if ((cVar3._M_node != local_60) || ((__k->features_used).tailcall == true)) {
          export_name._M_str = (pEVar2->name)._M_dataplus._M_p;
          export_name._M_len = (pEVar2->name)._M_string_length;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    (&local_80,(CWriter *)this,export_name);
          plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x1f0371);
          args = (Newline *)(plVar4 + 2);
          if ((Newline *)*plVar4 == args) {
            local_40._M_allocated_capacity = *(undefined8 *)args;
            local_40._8_8_ = plVar4[3];
            local_50._0_8_ = (Newline *)(local_50 + 0x10);
          }
          else {
            local_40._M_allocated_capacity = *(undefined8 *)args;
            local_50._0_8_ = (Newline *)*plVar4;
          }
          local_50._8_8_ = plVar4[1];
          *plVar4 = (long)args;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          str._M_str = (char *)args;
          str._M_len = (size_t)(pEVar2->name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    (&local_80,(_anonymous_namespace_ *)(pEVar2->name)._M_string_length,str);
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          WriteData(this,"/* export for tail-call of \'",0x1c);
          (anonymous_namespace)::CWriter::
          Write<std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&local_80,u,args);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          WriteTailCallFuncDeclaration(this,(string *)local_50);
          if (kind == Declarations) {
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [2])0x1f107a,u_00);
          }
          else {
            WriteData(this," ",1);
            Write(this);
            local_80._M_string_length = (size_type)Module::GetFunc(this->module_,&pEVar2->var);
            local_80._M_dataplus._M_p._0_4_ = 0;
            Write(this,(TailCallRef *)&local_80);
            WriteData(this,"(instance_ptr, tail_call_stack, next);",0x26);
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            this->should_write_indent_next_ = true;
            Write(this);
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            this->should_write_indent_next_ = true;
          }
          if ((Newline *)local_50._0_8_ != (Newline *)(local_50 + 0x10)) {
            operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
          }
        }
      }
      ppEVar5 = ppEVar5 + 1;
    } while (ppEVar5 != ppEVar1);
  }
  return;
}

Assistant:

void CWriter::WriteTailCallExports(CWriterPhase kind) {
  for (const Export* export_ : module_->exports) {
    if (export_->kind != ExternalKind::Func) {
      continue;
    }

    const Func* func = module_->GetFunc(export_->var);

    if (!IsImport(func->name) && !func->features_used.tailcall) {
      continue;
    }

    const std::string mangled_name = TailCallExportName(export_->name);

    Write(Newline(), "/* export for tail-call of '",
          SanitizeForComment(export_->name), "' */", Newline());
    if (kind == CWriterPhase::Declarations) {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(";", Newline());
    } else {
      WriteTailCallFuncDeclaration(mangled_name);
      Write(" ", OpenBrace());
      const Func* func = module_->GetFunc(export_->var);
      Write(TailCallRef(func->name), "(instance_ptr, tail_call_stack, next);",
            Newline(), CloseBrace(), Newline());
    }
  }
}